

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O3

OneofDescriptor * __thiscall
google::protobuf::Descriptor::real_oneof_decl(Descriptor *this,int index)

{
  if (index < this->real_oneof_decl_count_) {
    if (-1 < index) {
      if (index < this->oneof_decl_count_) {
        return this->oneof_decls_ + (uint)index;
      }
      goto LAB_0027e6e2;
    }
  }
  else {
    real_oneof_decl();
  }
  real_oneof_decl();
LAB_0027e6e2:
  real_oneof_decl();
}

Assistant:

inline const OneofDescriptor* Descriptor::real_oneof_decl(int index) const {
  ABSL_DCHECK(index < real_oneof_decl_count());
  return oneof_decl(index);
}